

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  pointer piVar5;
  SetKey<int,_Negation<int>_> *set;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  TypeParam ht1;
  TypeParam ht2;
  SetKey<int,_Negation<int>_> local_1e9;
  Hasher local_1e8;
  undefined1 local_1d8 [8];
  undefined8 *local_1d0;
  AssertHelper local_1c8;
  undefined1 local_1c0 [80];
  undefined **local_170;
  int *local_168 [2];
  size_type local_158;
  size_type sStack_150;
  bool bStack_13e;
  float local_148;
  float fStack_144;
  undefined8 uStack_140;
  Hasher local_138;
  int iStack_12c;
  size_type local_128;
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_120;
  size_type local_e0;
  undefined **local_d0;
  int *local_c8 [2];
  size_type local_b8;
  size_type sStack_b0;
  float local_a8;
  float fStack_a4;
  bool bStack_a0;
  bool bStack_9f;
  bool bStack_9e;
  undefined1 uStack_9d;
  uint uStack_9c;
  Hasher local_98;
  int iStack_8c;
  size_type local_88;
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_80 [2];
  
  local_1c0._0_8_ =
       (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffff00000000;
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_d0 = (undefined **)((ulong)local_d0 & 0xffffffff00000000);
  local_c8[0] = (int *)0x0;
  local_170 = &PTR__BaseHashtableInterface_00c161f8;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_168,0,(Hasher *)local_1c0,(Hasher *)local_1d8,
                     (Negation<int> *)&local_1e8,(SetKey<int,_Negation<int>_> *)&local_1c8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_d0);
  local_170 = &PTR__BaseHashtableInterface_00c16178;
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_1e8._0_8_ = (long *)0x0;
  local_1e8.num_compares_ = 0;
  local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
  local_1c0._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c161f8;
  set = &local_1e9;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(Hasher *)local_1d8,&local_1e8,(Negation<int> *)&local_1c8,set,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_1c0);
  local_d0 = &PTR__BaseHashtableInterface_00c16178;
  iVar4 = UniqueObjectHelper<int>(1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_168);
  bStack_13e = true;
  iStack_12c = -iVar4;
  iVar4 = UniqueObjectHelper<int>(2);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  iStack_8c = -iVar4;
  bStack_9e = true;
  iVar4 = UniqueObjectHelper<int>(10);
  local_1d8._0_4_ = iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_168,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_1c0,
                    (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)local_168,(const_reference)local_1d8);
  local_1d8._0_4_ = UniqueObjectHelper<int>(0x14);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_c8,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_1c0,
                    (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)local_c8,(const_reference)local_1d8);
  bVar3 = google::
          sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_168,
                       (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_1d0 = (undefined8 *)0x0;
  local_1d8[0] = (internal)!bVar3;
  if (bVar3) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)local_1d8,(AssertionResult *)"ht1 == ht2","true",
               "false",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x197,(char *)local_1c0._0_8_);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_);
    }
    if ((long *)local_1e8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  bStack_13e = bStack_9e;
  uStack_140._0_1_ = bStack_a0;
  uStack_140._1_1_ = bStack_9f;
  uStack_140._3_1_ = uStack_9d;
  uStack_140._4_4_ = uStack_9c;
  local_148 = local_a8;
  fStack_144 = fStack_a4;
  local_158 = local_b8;
  sStack_150 = sStack_b0;
  local_168[0] = local_c8[0];
  local_168[1] = local_c8[1];
  iStack_12c = iStack_8c;
  local_138.num_compares_ = local_98.num_compares_;
  local_138.id_ = local_98.id_;
  local_138.num_hashes_ = local_98.num_hashes_;
  local_128 = local_88;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::copy_from((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_168,
              (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_c8,4);
  local_1d8[0] = (internal)
                 google::
                 sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 ::operator==((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)local_168,
                              (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)local_c8);
  local_1d0 = (undefined8 *)0x0;
  if (!(bool)local_1d8[0]) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)local_1d8,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x199,(char *)local_1c0._0_8_);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_);
    }
    if ((long *)local_1e8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  local_d0 = &PTR__BaseHashtableInterface_00c161f8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_80);
  local_170 = &PTR__BaseHashtableInterface_00c161f8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_120);
  local_1c0._0_8_ =
       (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffff00000000;
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_d0 = (undefined **)((ulong)local_d0 & 0xffffffff00000000);
  local_c8[0] = (int *)0x0;
  local_170 = &PTR__BaseHashtableInterface_00c161f8;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_168,0,(Hasher *)local_1c0,(Hasher *)local_1d8,
                     (Negation<int> *)&local_1e8,(SetKey<int,_Negation<int>_> *)&local_1c8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_d0);
  local_170 = &PTR__BaseHashtableInterface_00c16178;
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_1e8.id_ = 0;
  local_1e8.num_hashes_ = 0;
  local_1e8.num_compares_ = 0;
  local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
  local_1c0._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c161f8;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(Hasher *)local_1d8,&local_1e8,(Negation<int> *)&local_1c8,
                     &local_1e9,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_1c0);
  local_d0 = &PTR__BaseHashtableInterface_00c16178;
  iVar4 = UniqueObjectHelper<int>(0x1e);
  local_1d8._0_4_ = iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_168,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_1c0,
                    (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)local_168,(const_reference)local_1d8);
  bStack_13e = bStack_9e;
  uStack_140._0_1_ = bStack_a0;
  uStack_140._1_1_ = bStack_9f;
  uStack_140._3_1_ = uStack_9d;
  uStack_140._4_4_ = uStack_9c;
  local_148 = local_a8;
  fStack_144 = fStack_a4;
  local_158 = local_b8;
  sStack_150 = sStack_b0;
  local_168[0] = local_c8[0];
  local_168[1] = local_c8[1];
  iStack_12c = iStack_8c;
  local_138.num_compares_ = local_98.num_compares_;
  local_138.id_ = local_98.id_;
  local_138.num_hashes_ = local_98.num_hashes_;
  local_128 = local_88;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::copy_from((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_168,
              (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_c8,4);
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  local_1d8 = (undefined1  [8])(local_e0 - local_128);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"0u","ht1.size()",(uint *)&local_1e8,(unsigned_long *)local_1d8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1c0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar5 = (pointer)0xaf1463;
    }
    else {
      piVar5 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x19f,(char *)piVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1c0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0 = &PTR__BaseHashtableInterface_00c161f8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_80);
  local_170 = &PTR__BaseHashtableInterface_00c161f8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_120);
  local_1c0._0_8_ =
       (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffff00000000;
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_d0 = (undefined **)((ulong)local_d0 & 0xffffffff00000000);
  local_c8[0] = (int *)0x0;
  local_170 = &PTR__BaseHashtableInterface_00c161f8;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_168,0,(Hasher *)local_1c0,(Hasher *)local_1d8,
                     (Negation<int> *)&local_1e8,(SetKey<int,_Negation<int>_> *)&local_1c8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_d0);
  local_170 = &PTR__BaseHashtableInterface_00c16178;
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_1e8.id_ = 0;
  local_1e8.num_hashes_ = 0;
  local_1e8.num_compares_ = 0;
  local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
  local_1c0._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c161f8;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(Hasher *)local_1d8,&local_1e8,(Negation<int> *)&local_1c8,
                     &local_1e9,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_1c0);
  local_d0 = &PTR__BaseHashtableInterface_00c16178;
  iVar4 = UniqueObjectHelper<int>(1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_168);
  bStack_13e = true;
  iStack_12c = -iVar4;
  iVar4 = UniqueObjectHelper<int>(1);
  local_1d8._0_4_ = iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_c8,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_1c0,
                    (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)local_c8,(const_reference)local_1d8);
  bStack_13e = bStack_9e;
  uStack_140._0_1_ = bStack_a0;
  uStack_140._1_1_ = bStack_9f;
  uStack_140._3_1_ = uStack_9d;
  uStack_140._4_4_ = uStack_9c;
  local_148 = local_a8;
  fStack_144 = fStack_a4;
  local_158 = local_b8;
  sStack_150 = sStack_b0;
  local_168[0] = local_c8[0];
  local_168[1] = local_c8[1];
  iStack_12c = iStack_8c;
  local_138.num_compares_ = local_98.num_compares_;
  local_138.id_ = local_98.id_;
  local_138.num_hashes_ = local_98.num_hashes_;
  local_128 = local_88;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::copy_from((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_168,
              (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_c8,4);
  local_1e8.id_ = 1;
  local_1d8 = (undefined1  [8])(local_e0 - local_128);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","ht1.size()",(uint *)&local_1e8,(unsigned_long *)local_1d8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1c0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar5 = (pointer)0xaf1463;
    }
    else {
      piVar5 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1a6,(char *)piVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1c0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_1e8.id_ = 1;
  local_1c8.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_1c8.data_._0_4_ = -(int)local_1c8.data_;
  pVar6 = google::
          sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_168,(int *)&local_1c8);
  local_1d8._1_7_ = 0;
  local_1d8[0] = (internal)(pVar6.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","ht1.count(this->UniqueKey(1))",(uint *)&local_1e8,
             (unsigned_long *)local_1d8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1c0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar5 = (pointer)0xaf1463;
    }
    else {
      piVar5 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1a7,(char *)piVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1c0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0 = &PTR__BaseHashtableInterface_00c161f8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_80);
  local_170 = &PTR__BaseHashtableInterface_00c161f8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_120);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}